

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void testutil_random_fe(secp256k1_fe *x)

{
  int iVar1;
  uchar bin [32];
  uchar auStack_38 [40];
  
  do {
    testrand256(auStack_38);
    iVar1 = secp256k1_fe_set_b32_limit(x,auStack_38);
  } while (iVar1 == 0);
  return;
}

Assistant:

static void testutil_random_fe(secp256k1_fe *x) {
    unsigned char bin[32];
    do {
        testrand256(bin);
        if (secp256k1_fe_set_b32_limit(x, bin)) {
            return;
        }
    } while(1);
}